

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O2

void __thiscall
nuraft::snapshot_io_mgr::io_queue_elem::io_queue_elem
          (io_queue_elem *this,ptr<raft_server> *r,ptr<snapshot> *s,ptr<snapshot_sync_ctx> *c,
          ptr<peer> *p,
          function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
          *h)

{
  std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)this,
             &r->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>,
             &s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->sync_ctx_).
              super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>,
             &c->super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
             &p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function(&this->handler_,h);
  return;
}

Assistant:

io_queue_elem( ptr<raft_server> r,
                   ptr<snapshot> s,
                   ptr<snapshot_sync_ctx> c,
                   ptr<peer> p,
                   std::function< void(ptr<resp_msg>&, ptr<rpc_exception>&) >& h )
        : raft_(r)
        , snapshot_(s)
        , sync_ctx_(c)
        , dst_(p)
        , handler_(h)
        {}